

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

int opengv::absolute_pose::modules::gpnp2::init(EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  Vector3d temp;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_60;
  double local_48;
  double dStack_40;
  double local_38;
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_48,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_60);
  dVar15 = local_48 * local_48;
  dVar21 = dStack_40 * dStack_40;
  dVar8 = local_38 * local_38;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&local_48,&local_60);
  dVar16 = local_48 * local_48;
  dVar22 = dStack_40 * dStack_40;
  dVar9 = local_38 * local_38;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&local_48,&local_60);
  dVar17 = local_48 * local_48;
  dVar23 = dStack_40 * dStack_40;
  dVar10 = local_38 * local_38;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&local_48,&local_60);
  dVar18 = local_48 * local_48;
  dVar24 = dStack_40 * dStack_40;
  dVar11 = local_38 * local_38;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)&local_48,&local_60);
  dVar1 = in_RCX[1];
  dVar2 = *in_RCX;
  dVar3 = in_RCX[4];
  dVar4 = in_RCX[3];
  auVar204._8_8_ = 0;
  auVar204._0_8_ = dVar4;
  dVar5 = in_RCX[5];
  auVar316._8_8_ = 0;
  auVar316._0_8_ = dVar5;
  auVar19 = ZEXT816(0xc000000000000000);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  auVar20 = vsqrtsd_avx(auVar25,auVar25);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = dVar2 * -2.0;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = dVar1 * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar302,auVar204,auVar148);
  dVar6 = in_RCX[2];
  auVar351._8_8_ = 0;
  auVar351._0_8_ = dVar6 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar351,auVar316,auVar14);
  *(double *)ctx =
       dVar5 * dVar5 +
       dVar6 * dVar6 + dVar3 * dVar3 + dVar1 * dVar1 + dVar4 * dVar4 + auVar14._0_8_ + dVar2 * dVar2
  ;
  dVar1 = *in_RDX;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = in_RCX[3];
  auVar263._8_8_ = 0;
  auVar263._0_8_ = *in_RCX;
  dVar2 = in_RDX[1];
  auVar303._8_8_ = 0;
  auVar303._0_8_ = in_RCX[1];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar1 * -2.0 * in_RCX[3];
  auVar149._8_8_ = 0;
  auVar149._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar27,auVar263,auVar149);
  dVar1 = in_RDX[3];
  auVar150._8_8_ = 0;
  auVar150._0_8_ = dVar1;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar264,auVar150,auVar14);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar28,auVar205,auVar14);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar151,auVar303,auVar14);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = in_RCX[4];
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar108,auVar29,auVar14);
  dVar1 = in_RDX[4];
  auVar152._8_8_ = 0;
  auVar152._0_8_ = dVar1;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar206,auVar152,auVar14);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar109,auVar29,auVar14);
  dVar1 = in_RDX[2];
  auVar207._8_8_ = 0;
  auVar207._0_8_ = in_RCX[2];
  auVar153._8_8_ = 0;
  auVar153._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar153,auVar207,auVar14);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = in_RCX[5];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar30,auVar110,auVar14);
  dVar1 = in_RDX[5];
  auVar154._8_8_ = 0;
  auVar154._0_8_ = dVar1;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar208,auVar154,auVar14);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar31,auVar110,auVar14);
  *(long *)(ctx + 0x50) = auVar14._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  dVar3 = in_RDX[4];
  dVar4 = in_RDX[3];
  auVar209._8_8_ = 0;
  auVar209._0_8_ = dVar4;
  dVar5 = in_RDX[5];
  auVar317._8_8_ = 0;
  auVar317._0_8_ = dVar5;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = dVar2 * -2.0;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = dVar1 * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar304,auVar209,auVar155);
  dVar6 = in_RDX[2];
  auVar352._8_8_ = 0;
  auVar352._0_8_ = dVar6 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar352,auVar317,auVar14);
  *(double *)(ctx + 0xa0) =
       dVar5 * dVar5 +
       dVar6 * dVar6 + dVar3 * dVar3 + dVar1 * dVar1 + dVar4 * dVar4 + auVar14._0_8_ + dVar2 * dVar2
  ;
  dVar1 = *in_RSI;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = in_RCX[3];
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *in_RCX;
  dVar2 = in_RSI[1];
  auVar305._8_8_ = 0;
  auVar305._0_8_ = in_RCX[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1 * -2.0 * in_RCX[3];
  auVar156._8_8_ = 0;
  auVar156._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar32,auVar265,auVar156);
  dVar1 = in_RSI[3];
  auVar157._8_8_ = 0;
  auVar157._0_8_ = dVar1;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar266,auVar157,auVar14);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar33,auVar210,auVar14);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar158,auVar305,auVar14);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = in_RCX[4];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar111,auVar34,auVar14);
  dVar1 = in_RSI[4];
  auVar159._8_8_ = 0;
  auVar159._0_8_ = dVar1;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar211,auVar159,auVar14);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar112,auVar34,auVar14);
  dVar1 = in_RSI[2];
  auVar212._8_8_ = 0;
  auVar212._0_8_ = in_RCX[2];
  auVar160._8_8_ = 0;
  auVar160._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar160,auVar212,auVar14);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = in_RCX[5];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar35,auVar113,auVar14);
  dVar1 = in_RSI[5];
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar1;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar213,auVar161,auVar14);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar36,auVar113,auVar14);
  *(long *)(ctx + 0xf0) = auVar14._0_8_;
  dVar1 = *in_RSI;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = in_RDX[3];
  auVar267._8_8_ = 0;
  auVar267._0_8_ = *in_RDX;
  dVar2 = in_RSI[1];
  auVar306._8_8_ = 0;
  auVar306._0_8_ = in_RDX[1];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar1 * -2.0 * in_RDX[3];
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar37,auVar267,auVar162);
  dVar1 = in_RSI[3];
  auVar163._8_8_ = 0;
  auVar163._0_8_ = dVar1;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *in_RDX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar268,auVar163,auVar14);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar38,auVar214,auVar14);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar164,auVar306,auVar14);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = in_RDX[4];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar114,auVar39,auVar14);
  dVar1 = in_RSI[4];
  auVar165._8_8_ = 0;
  auVar165._0_8_ = dVar1;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = in_RDX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar215,auVar165,auVar14);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar115,auVar39,auVar14);
  dVar1 = in_RSI[2];
  auVar216._8_8_ = 0;
  auVar216._0_8_ = in_RDX[2];
  auVar166._8_8_ = 0;
  auVar166._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar166,auVar216,auVar14);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = in_RDX[5];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar40,auVar116,auVar14);
  dVar1 = in_RSI[5];
  auVar167._8_8_ = 0;
  auVar167._0_8_ = dVar1;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = in_RDX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar217,auVar167,auVar14);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar41,auVar116,auVar14);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar8 + dVar15 + dVar21;
  auVar14 = vsqrtsd_avx(auVar19,auVar14);
  *(long *)(ctx + 0x140) = auVar12._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[3];
  auVar218._8_8_ = 0;
  auVar218._0_8_ = dVar3;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar1 * -2.0;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar1 * dVar1 - auVar14._0_8_ * auVar14._0_8_;
  auVar14 = vfmadd213sd_fma(auVar42,auVar218,auVar168);
  dVar1 = in_RSI[4];
  auVar169._8_8_ = 0;
  auVar169._0_8_ = dVar1;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar2 * dVar2 + dVar3 * dVar3 + auVar14._0_8_;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar117,auVar169,auVar43);
  dVar2 = in_RSI[2];
  dVar3 = in_RSI[5];
  auVar170._8_8_ = 0;
  auVar170._0_8_ = dVar3;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar2 * dVar2 + dVar1 * dVar1 + auVar14._0_8_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar118,auVar170,auVar44);
  *(double *)(ctx + 400) = dVar3 * dVar3 + auVar14._0_8_;
  dVar1 = in_RCX[1];
  dVar2 = *in_RCX;
  dVar3 = in_RCX[7];
  dVar4 = in_RCX[6];
  auVar219._8_8_ = 0;
  auVar219._0_8_ = dVar4;
  dVar5 = in_RCX[8];
  auVar318._8_8_ = 0;
  auVar318._0_8_ = dVar5;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = dVar2 * -2.0;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = dVar1 * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar307,auVar219,auVar171);
  dVar6 = in_RCX[2];
  auVar353._8_8_ = 0;
  auVar353._0_8_ = dVar6 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar353,auVar318,auVar14);
  *(double *)(ctx + 8) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar14._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *in_RCX;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = in_RCX[2];
  auVar172._8_8_ = 0;
  auVar172._0_8_ = dVar2 + dVar2;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = (dVar1 + dVar1) * in_RCX[1];
  auVar14 = vfmadd231sd_fma(auVar220,auVar269,auVar172);
  dVar3 = in_RDX[2];
  auVar319._8_8_ = 0;
  auVar319._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar319,auVar354,auVar14);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = in_RCX[6];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar45,auVar221,auVar14);
  dVar2 = in_RDX[6];
  auVar320._8_8_ = 0;
  auVar320._0_8_ = dVar2;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar270,auVar320,auVar14);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar46,auVar221,auVar14);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = in_RCX[7];
  auVar119._8_8_ = 0;
  auVar119._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar119,auVar222,auVar14);
  dVar1 = in_RDX[7];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar1;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar271,auVar47,auVar14);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = in_RCX[8];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar48,auVar222,auVar14);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar173,auVar120,auVar14);
  dVar1 = in_RDX[8];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar1;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar223,auVar49,auVar14);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar50,auVar120,auVar14);
  *(long *)(ctx + 0x58) = auVar14._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  dVar3 = in_RDX[7];
  dVar4 = in_RDX[6];
  auVar224._8_8_ = 0;
  auVar224._0_8_ = dVar4;
  dVar5 = in_RDX[8];
  auVar321._8_8_ = 0;
  auVar321._0_8_ = dVar5;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = dVar2 * -2.0;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = dVar1 * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar308,auVar224,auVar174);
  dVar6 = in_RDX[2];
  auVar355._8_8_ = 0;
  auVar355._0_8_ = dVar6 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar355,auVar321,auVar14);
  *(double *)(ctx + 0xa8) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar14._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = *in_RCX;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = in_RCX[2];
  auVar175._8_8_ = 0;
  auVar175._0_8_ = dVar2 + dVar2;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = (dVar1 + dVar1) * in_RCX[1];
  auVar14 = vfmadd231sd_fma(auVar225,auVar272,auVar175);
  dVar3 = in_RSI[2];
  auVar322._8_8_ = 0;
  auVar322._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar322,auVar356,auVar14);
  auVar226._8_8_ = 0;
  auVar226._0_8_ = in_RCX[6];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar51,auVar226,auVar14);
  dVar2 = in_RSI[6];
  auVar323._8_8_ = 0;
  auVar323._0_8_ = dVar2;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar273,auVar323,auVar14);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar52,auVar226,auVar14);
  auVar227._8_8_ = 0;
  auVar227._0_8_ = in_RCX[7];
  auVar121._8_8_ = 0;
  auVar121._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar121,auVar227,auVar14);
  dVar1 = in_RSI[7];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar1;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar274,auVar53,auVar14);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = in_RCX[8];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar54,auVar227,auVar14);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar176,auVar122,auVar14);
  dVar1 = in_RSI[8];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar1;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar228,auVar55,auVar14);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar56,auVar122,auVar14);
  *(long *)(ctx + 0xf8) = auVar14._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = *in_RDX;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = in_RDX[2];
  auVar177._8_8_ = 0;
  auVar177._0_8_ = dVar2 + dVar2;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = (dVar1 + dVar1) * in_RDX[1];
  auVar14 = vfmadd231sd_fma(auVar229,auVar275,auVar177);
  dVar3 = in_RSI[2];
  auVar324._8_8_ = 0;
  auVar324._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar324,auVar357,auVar14);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = in_RDX[6];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar57,auVar230,auVar14);
  dVar2 = in_RSI[6];
  auVar325._8_8_ = 0;
  auVar325._0_8_ = dVar2;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = *in_RDX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar276,auVar325,auVar14);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar58,auVar230,auVar14);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = in_RDX[7];
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar123,auVar231,auVar14);
  dVar1 = in_RSI[7];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar1;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = in_RDX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar277,auVar59,auVar14);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = in_RDX[8];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar60,auVar231,auVar14);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar178,auVar124,auVar14);
  dVar1 = in_RSI[8];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar1;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = in_RDX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar232,auVar61,auVar14);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar1 + dVar1;
  auVar13 = vfmadd213sd_fma(auVar62,auVar124,auVar14);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar9 + dVar16 + dVar22;
  auVar14 = vsqrtsd_avx(auVar19,auVar12);
  *(long *)(ctx + 0x148) = auVar13._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[6];
  auVar278._8_8_ = 0;
  auVar278._0_8_ = dVar4;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar1 * -2.0;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = (dVar1 * dVar1 - auVar14._0_8_ * auVar14._0_8_) + dVar2 * dVar2 + dVar3 * dVar3;
  auVar14 = vfmadd213sd_fma(auVar63,auVar278,auVar179);
  dVar1 = in_RSI[7];
  auVar180._8_8_ = 0;
  auVar180._0_8_ = dVar1;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar4 * dVar4 + auVar14._0_8_;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar125,auVar180,auVar64);
  dVar2 = in_RSI[8];
  auVar126._8_8_ = 0;
  auVar126._0_8_ = dVar2;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar1 * dVar1 + auVar14._0_8_;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar181,auVar126,auVar65);
  *(double *)(ctx + 0x198) = dVar2 * dVar2 + auVar14._0_8_;
  dVar1 = in_RCX[1];
  dVar2 = *in_RCX;
  dVar3 = in_RCX[10];
  dVar4 = in_RCX[9];
  auVar233._8_8_ = 0;
  auVar233._0_8_ = dVar4;
  dVar5 = in_RCX[0xb];
  auVar326._8_8_ = 0;
  auVar326._0_8_ = dVar5;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = dVar2 * -2.0;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = dVar1 * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar309,auVar233,auVar182);
  dVar6 = in_RCX[2];
  auVar358._8_8_ = 0;
  auVar358._0_8_ = dVar6 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar358,auVar326,auVar14);
  *(double *)(ctx + 0x10) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar14._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = *in_RCX;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = in_RCX[2];
  auVar183._8_8_ = 0;
  auVar183._0_8_ = dVar2 + dVar2;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = (dVar1 + dVar1) * in_RCX[1];
  auVar14 = vfmadd231sd_fma(auVar234,auVar279,auVar183);
  dVar3 = in_RDX[2];
  auVar327._8_8_ = 0;
  auVar327._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar327,auVar359,auVar14);
  auVar235._8_8_ = 0;
  auVar235._0_8_ = in_RCX[9];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar66,auVar235,auVar14);
  dVar2 = in_RDX[9];
  auVar328._8_8_ = 0;
  auVar328._0_8_ = dVar2;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar280,auVar328,auVar14);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar67,auVar235,auVar14);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = in_RCX[10];
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar127,auVar236,auVar14);
  dVar1 = in_RDX[10];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar1;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar281,auVar68,auVar14);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = in_RCX[0xb];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar69,auVar236,auVar14);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar184,auVar128,auVar14);
  dVar1 = in_RDX[0xb];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar1;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar237,auVar70,auVar14);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar71,auVar128,auVar14);
  *(long *)(ctx + 0x60) = auVar14._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = *in_RDX;
  dVar3 = in_RDX[10];
  dVar4 = in_RDX[9];
  auVar238._8_8_ = 0;
  auVar238._0_8_ = dVar4;
  dVar5 = in_RDX[0xb];
  auVar329._8_8_ = 0;
  auVar329._0_8_ = dVar5;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = dVar2 * -2.0;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = dVar1 * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar310,auVar238,auVar185);
  dVar6 = in_RDX[2];
  auVar360._8_8_ = 0;
  auVar360._0_8_ = dVar6 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar360,auVar329,auVar14);
  *(double *)(ctx + 0xb0) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar14._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *in_RCX;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = in_RCX[2];
  auVar186._8_8_ = 0;
  auVar186._0_8_ = dVar2 + dVar2;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = (dVar1 + dVar1) * in_RCX[1];
  auVar14 = vfmadd231sd_fma(auVar239,auVar282,auVar186);
  dVar3 = in_RSI[2];
  auVar330._8_8_ = 0;
  auVar330._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar330,auVar361,auVar14);
  auVar240._8_8_ = 0;
  auVar240._0_8_ = in_RCX[9];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar72,auVar240,auVar14);
  dVar2 = in_RSI[9];
  auVar331._8_8_ = 0;
  auVar331._0_8_ = dVar2;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar283,auVar331,auVar14);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar73,auVar240,auVar14);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = in_RCX[10];
  auVar129._8_8_ = 0;
  auVar129._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar129,auVar241,auVar14);
  dVar1 = in_RSI[10];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar1;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar284,auVar74,auVar14);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = in_RCX[0xb];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar75,auVar241,auVar14);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar187,auVar130,auVar14);
  dVar1 = in_RSI[0xb];
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar1;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar242,auVar76,auVar14);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar77,auVar130,auVar14);
  *(long *)(ctx + 0x100) = auVar14._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = *in_RDX;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = in_RDX[2];
  auVar188._8_8_ = 0;
  auVar188._0_8_ = dVar2 + dVar2;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = (dVar1 + dVar1) * in_RDX[1];
  auVar14 = vfmadd231sd_fma(auVar243,auVar285,auVar188);
  dVar3 = in_RSI[2];
  auVar332._8_8_ = 0;
  auVar332._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar332,auVar362,auVar14);
  auVar244._8_8_ = 0;
  auVar244._0_8_ = in_RDX[9];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar78,auVar244,auVar14);
  dVar2 = in_RSI[9];
  auVar333._8_8_ = 0;
  auVar333._0_8_ = dVar2;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = *in_RDX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar286,auVar333,auVar14);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar79,auVar244,auVar14);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = in_RDX[10];
  auVar131._8_8_ = 0;
  auVar131._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar131,auVar245,auVar14);
  dVar1 = in_RSI[10];
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar1;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = in_RDX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar287,auVar80,auVar14);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = in_RDX[0xb];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar81,auVar245,auVar14);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar189,auVar132,auVar14);
  dVar1 = in_RSI[0xb];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar1;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = in_RDX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar246,auVar82,auVar14);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar1 + dVar1;
  auVar12 = vfmadd213sd_fma(auVar83,auVar132,auVar14);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar10 + dVar17 + dVar23;
  auVar14 = vsqrtsd_avx(auVar19,auVar13);
  *(long *)(ctx + 0x150) = auVar12._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[9];
  auVar288._8_8_ = 0;
  auVar288._0_8_ = dVar4;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar1 * -2.0;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = (dVar1 * dVar1 - auVar14._0_8_ * auVar14._0_8_) + dVar2 * dVar2 + dVar3 * dVar3;
  auVar14 = vfmadd213sd_fma(auVar84,auVar288,auVar190);
  dVar1 = in_RSI[10];
  auVar191._8_8_ = 0;
  auVar191._0_8_ = dVar1;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar4 * dVar4 + auVar14._0_8_;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar133,auVar191,auVar85);
  dVar2 = in_RSI[0xb];
  auVar134._8_8_ = 0;
  auVar134._0_8_ = dVar2;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar1 * dVar1 + auVar14._0_8_;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar192,auVar134,auVar86);
  *(double *)(ctx + 0x1a0) = dVar2 * dVar2 + auVar14._0_8_;
  dVar1 = in_RCX[4];
  dVar2 = in_RCX[3];
  dVar3 = in_RCX[7];
  dVar4 = in_RCX[6];
  auVar247._8_8_ = 0;
  auVar247._0_8_ = dVar4;
  dVar5 = in_RCX[8];
  auVar334._8_8_ = 0;
  auVar334._0_8_ = dVar5;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = dVar2 * -2.0;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = dVar1 * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar311,auVar247,auVar193);
  dVar6 = in_RCX[5];
  auVar363._8_8_ = 0;
  auVar363._0_8_ = dVar6 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar363,auVar334,auVar14);
  *(double *)(ctx + 0x18) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar14._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RDX[4];
  dVar2 = in_RDX[3];
  auVar289._8_8_ = 0;
  auVar289._0_8_ = in_RCX[3];
  auVar364._8_8_ = 0;
  auVar364._0_8_ = in_RCX[5];
  auVar387._8_8_ = 0;
  auVar387._0_8_ = in_RCX[6];
  auVar400._8_8_ = 0;
  auVar400._0_8_ = in_RCX[7];
  auVar412._8_8_ = 0;
  auVar412._0_8_ = in_RCX[8];
  auVar194._8_8_ = 0;
  auVar194._0_8_ = dVar2 + dVar2;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = (dVar1 + dVar1) * in_RCX[4];
  auVar14 = vfmadd231sd_fma(auVar248,auVar289,auVar194);
  dVar3 = in_RDX[5];
  auVar335._8_8_ = 0;
  auVar335._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar335,auVar364,auVar14);
  dVar4 = in_RDX[6];
  auVar249._8_8_ = 0;
  auVar249._0_8_ = dVar4;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar374,auVar387,auVar14);
  dVar4 = in_RDX[7];
  auVar336._8_8_ = 0;
  auVar336._0_8_ = dVar4;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar394,auVar400,auVar14);
  dVar4 = in_RDX[8];
  auVar375._8_8_ = 0;
  auVar375._0_8_ = dVar4;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar406,auVar412,auVar14);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar87,auVar387,auVar14);
  auVar290._8_8_ = 0;
  auVar290._0_8_ = in_RCX[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar290,auVar249,auVar14);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar88,auVar400,auVar14);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = in_RCX[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar135,auVar336,auVar14);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar89,auVar412,auVar14);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = in_RCX[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar136,auVar375,auVar14);
  *(long *)(ctx + 0x68) = auVar14._0_8_;
  dVar1 = in_RDX[4];
  dVar2 = in_RDX[3];
  dVar3 = in_RDX[7];
  dVar4 = in_RDX[6];
  auVar250._8_8_ = 0;
  auVar250._0_8_ = dVar4;
  dVar5 = in_RDX[8];
  auVar337._8_8_ = 0;
  auVar337._0_8_ = dVar5;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = dVar2 * -2.0;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = dVar1 * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar312,auVar250,auVar195);
  dVar6 = in_RDX[5];
  auVar365._8_8_ = 0;
  auVar365._0_8_ = dVar6 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar365,auVar337,auVar14);
  *(double *)(ctx + 0xb8) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar14._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar291._8_8_ = 0;
  auVar291._0_8_ = in_RCX[3];
  auVar366._8_8_ = 0;
  auVar366._0_8_ = in_RCX[5];
  auVar388._8_8_ = 0;
  auVar388._0_8_ = in_RCX[6];
  auVar401._8_8_ = 0;
  auVar401._0_8_ = in_RCX[7];
  auVar413._8_8_ = 0;
  auVar413._0_8_ = in_RCX[8];
  auVar196._8_8_ = 0;
  auVar196._0_8_ = dVar2 + dVar2;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = (dVar1 + dVar1) * in_RCX[4];
  auVar14 = vfmadd231sd_fma(auVar251,auVar291,auVar196);
  dVar3 = in_RSI[5];
  auVar338._8_8_ = 0;
  auVar338._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar338,auVar366,auVar14);
  dVar4 = in_RSI[6];
  auVar252._8_8_ = 0;
  auVar252._0_8_ = dVar4;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar376,auVar388,auVar14);
  dVar4 = in_RSI[7];
  auVar339._8_8_ = 0;
  auVar339._0_8_ = dVar4;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar395,auVar401,auVar14);
  dVar4 = in_RSI[8];
  auVar377._8_8_ = 0;
  auVar377._0_8_ = dVar4;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar407,auVar413,auVar14);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar90,auVar388,auVar14);
  auVar292._8_8_ = 0;
  auVar292._0_8_ = in_RCX[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar292,auVar252,auVar14);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar91,auVar401,auVar14);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = in_RCX[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar137,auVar339,auVar14);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar92,auVar413,auVar14);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = in_RCX[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar138,auVar377,auVar14);
  *(long *)(ctx + 0x108) = auVar14._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar293._8_8_ = 0;
  auVar293._0_8_ = in_RDX[3];
  auVar367._8_8_ = 0;
  auVar367._0_8_ = in_RDX[5];
  auVar389._8_8_ = 0;
  auVar389._0_8_ = in_RDX[6];
  auVar402._8_8_ = 0;
  auVar402._0_8_ = in_RDX[7];
  auVar414._8_8_ = 0;
  auVar414._0_8_ = in_RDX[8];
  auVar197._8_8_ = 0;
  auVar197._0_8_ = dVar2 + dVar2;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = (dVar1 + dVar1) * in_RDX[4];
  auVar14 = vfmadd231sd_fma(auVar253,auVar293,auVar197);
  dVar3 = in_RSI[5];
  auVar340._8_8_ = 0;
  auVar340._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar340,auVar367,auVar14);
  dVar4 = in_RSI[6];
  auVar254._8_8_ = 0;
  auVar254._0_8_ = dVar4;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar378,auVar389,auVar14);
  dVar4 = in_RSI[7];
  auVar341._8_8_ = 0;
  auVar341._0_8_ = dVar4;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar396,auVar402,auVar14);
  dVar4 = in_RSI[8];
  auVar379._8_8_ = 0;
  auVar379._0_8_ = dVar4;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar408,auVar414,auVar14);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar93,auVar389,auVar14);
  auVar294._8_8_ = 0;
  auVar294._0_8_ = in_RDX[3] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar294,auVar254,auVar14);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar11 + dVar18 + dVar24;
  auVar14 = vsqrtsd_avx(auVar19,auVar7);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar1 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar94,auVar402,auVar12);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = in_RDX[4] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar139,auVar341,auVar12);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar3 * -2.0;
  auVar12 = vfmadd213sd_fma(auVar95,auVar414,auVar12);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = in_RDX[5] * -2.0;
  auVar12 = vfmadd213sd_fma(auVar140,auVar379,auVar12);
  *(long *)(ctx + 0x158) = auVar12._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  dVar3 = in_RSI[5];
  dVar4 = in_RSI[6];
  auVar295._8_8_ = 0;
  auVar295._0_8_ = dVar4;
  dVar5 = in_RSI[7];
  auVar313._8_8_ = 0;
  auVar313._0_8_ = dVar5;
  dVar6 = in_RSI[8];
  auVar342._8_8_ = 0;
  auVar342._0_8_ = dVar6;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar1 * -2.0;
  auVar198._8_8_ = 0;
  auVar198._0_8_ =
       dVar6 * dVar6 +
       dVar5 * dVar5 +
       (dVar1 * dVar1 - auVar14._0_8_ * auVar14._0_8_) + dVar2 * dVar2 + dVar3 * dVar3 +
       dVar4 * dVar4;
  auVar14 = vfmadd213sd_fma(auVar96,auVar295,auVar198);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar141,auVar313,auVar14);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar97,auVar342,auVar14);
  *(long *)(ctx + 0x1a8) = auVar14._0_8_;
  dVar1 = in_RCX[4];
  dVar2 = in_RCX[3];
  dVar3 = in_RCX[10];
  dVar4 = in_RCX[9];
  auVar255._8_8_ = 0;
  auVar255._0_8_ = dVar4;
  dVar5 = in_RCX[0xb];
  auVar343._8_8_ = 0;
  auVar343._0_8_ = dVar5;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = dVar2 * -2.0;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = dVar1 * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar314,auVar255,auVar199);
  dVar6 = in_RCX[5];
  auVar368._8_8_ = 0;
  auVar368._0_8_ = dVar6 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar368,auVar343,auVar14);
  *(double *)(ctx + 0x20) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar14._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RDX[4];
  dVar2 = in_RDX[3];
  auVar296._8_8_ = 0;
  auVar296._0_8_ = in_RCX[3];
  auVar369._8_8_ = 0;
  auVar369._0_8_ = in_RCX[5];
  auVar390._8_8_ = 0;
  auVar390._0_8_ = in_RCX[9];
  auVar403._8_8_ = 0;
  auVar403._0_8_ = in_RCX[10];
  auVar415._8_8_ = 0;
  auVar415._0_8_ = in_RCX[0xb];
  auVar200._8_8_ = 0;
  auVar200._0_8_ = dVar2 + dVar2;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = (dVar1 + dVar1) * in_RCX[4];
  auVar14 = vfmadd231sd_fma(auVar256,auVar296,auVar200);
  dVar3 = in_RDX[5];
  auVar344._8_8_ = 0;
  auVar344._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar344,auVar369,auVar14);
  dVar4 = in_RDX[9];
  auVar257._8_8_ = 0;
  auVar257._0_8_ = dVar4;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar380,auVar390,auVar14);
  dVar4 = in_RDX[10];
  auVar345._8_8_ = 0;
  auVar345._0_8_ = dVar4;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar397,auVar403,auVar14);
  dVar4 = in_RDX[0xb];
  auVar381._8_8_ = 0;
  auVar381._0_8_ = dVar4;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar409,auVar415,auVar14);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar98,auVar390,auVar14);
  auVar297._8_8_ = 0;
  auVar297._0_8_ = in_RCX[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar297,auVar257,auVar14);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar99,auVar403,auVar14);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = in_RCX[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar142,auVar345,auVar14);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar100,auVar415,auVar14);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = in_RCX[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar143,auVar381,auVar14);
  *(long *)(ctx + 0x70) = auVar14._0_8_;
  dVar1 = in_RDX[4];
  dVar2 = in_RDX[3];
  dVar3 = in_RDX[10];
  dVar4 = in_RDX[9];
  auVar258._8_8_ = 0;
  auVar258._0_8_ = dVar4;
  dVar5 = in_RDX[0xb];
  auVar346._8_8_ = 0;
  auVar346._0_8_ = dVar5;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = dVar2 * -2.0;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = dVar1 * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar315,auVar258,auVar201);
  dVar6 = in_RDX[5];
  auVar370._8_8_ = 0;
  auVar370._0_8_ = dVar6 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar370,auVar346,auVar14);
  *(double *)(ctx + 0xc0) =
       dVar5 * dVar5 +
       dVar3 * dVar3 + dVar4 * dVar4 + dVar6 * dVar6 + dVar1 * dVar1 + auVar14._0_8_ + dVar2 * dVar2
  ;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar298._8_8_ = 0;
  auVar298._0_8_ = in_RCX[3];
  auVar371._8_8_ = 0;
  auVar371._0_8_ = in_RCX[5];
  auVar391._8_8_ = 0;
  auVar391._0_8_ = in_RCX[9];
  auVar404._8_8_ = 0;
  auVar404._0_8_ = in_RCX[10];
  auVar416._8_8_ = 0;
  auVar416._0_8_ = in_RCX[0xb];
  auVar202._8_8_ = 0;
  auVar202._0_8_ = dVar2 + dVar2;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = (dVar1 + dVar1) * in_RCX[4];
  auVar14 = vfmadd231sd_fma(auVar259,auVar298,auVar202);
  dVar3 = in_RSI[5];
  auVar347._8_8_ = 0;
  auVar347._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar347,auVar371,auVar14);
  dVar4 = in_RSI[9];
  auVar260._8_8_ = 0;
  auVar260._0_8_ = dVar4;
  auVar382._8_8_ = 0;
  auVar382._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar382,auVar391,auVar14);
  dVar4 = in_RSI[10];
  auVar348._8_8_ = 0;
  auVar348._0_8_ = dVar4;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar398,auVar404,auVar14);
  dVar4 = in_RSI[0xb];
  auVar383._8_8_ = 0;
  auVar383._0_8_ = dVar4;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar410,auVar416,auVar14);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar101,auVar391,auVar14);
  auVar299._8_8_ = 0;
  auVar299._0_8_ = in_RCX[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar299,auVar260,auVar14);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar102,auVar404,auVar14);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = in_RCX[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar144,auVar348,auVar14);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar103,auVar416,auVar14);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = in_RCX[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar145,auVar383,auVar14);
  *(long *)(ctx + 0x110) = auVar14._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar300._8_8_ = 0;
  auVar300._0_8_ = in_RDX[3];
  auVar372._8_8_ = 0;
  auVar372._0_8_ = in_RDX[5];
  auVar392._8_8_ = 0;
  auVar392._0_8_ = in_RDX[9];
  auVar405._8_8_ = 0;
  auVar405._0_8_ = in_RDX[10];
  auVar417._8_8_ = 0;
  auVar417._0_8_ = in_RDX[0xb];
  auVar203._8_8_ = 0;
  auVar203._0_8_ = dVar2 + dVar2;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = (dVar1 + dVar1) * in_RDX[4];
  auVar14 = vfmadd231sd_fma(auVar261,auVar300,auVar203);
  dVar3 = in_RSI[5];
  auVar349._8_8_ = 0;
  auVar349._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar349,auVar372,auVar14);
  dVar4 = in_RSI[9];
  auVar262._8_8_ = 0;
  auVar262._0_8_ = dVar4;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar384,auVar392,auVar14);
  dVar4 = in_RSI[10];
  auVar350._8_8_ = 0;
  auVar350._0_8_ = dVar4;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar399,auVar405,auVar14);
  dVar4 = in_RSI[0xb];
  auVar385._8_8_ = 0;
  auVar385._0_8_ = dVar4;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar411,auVar417,auVar14);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar104,auVar392,auVar14);
  auVar301._8_8_ = 0;
  auVar301._0_8_ = in_RDX[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar301,auVar262,auVar14);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar105,auVar405,auVar14);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = in_RDX[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar146,auVar350,auVar14);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar106,auVar417,auVar14);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = in_RDX[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar147,auVar385,auVar14);
  *(long *)(ctx + 0x160) = auVar14._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  dVar3 = in_RSI[5];
  dVar4 = in_RSI[9];
  auVar393._8_8_ = 0;
  auVar393._0_8_ = dVar4;
  dVar5 = in_RSI[10];
  auVar386._8_8_ = 0;
  auVar386._0_8_ = dVar5;
  dVar6 = in_RSI[0xb];
  auVar373._8_8_ = 0;
  auVar373._0_8_ = dVar6;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       dVar6 * dVar6 +
       (dVar1 * dVar1 - auVar20._0_8_ * auVar20._0_8_) + dVar2 * dVar2 + dVar3 * dVar3 +
       dVar4 * dVar4 + dVar5 * dVar5;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar107,auVar393,auVar19);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar26,auVar386,auVar14);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar20,auVar373,auVar14);
  *(long *)(ctx + 0x1b0) = auVar14._0_8_;
  return (int)ctx;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp2::init(
    Eigen::Matrix<double,10,6> & groebnerMatrix,
    const Eigen::Matrix<double,12,1> & a,
    Eigen::Matrix<double,12,1> & n,
    Eigen::Matrix<double,12,1> & m,
    Eigen::Vector3d & c0,
    Eigen::Vector3d & c1,
    Eigen::Vector3d & c2,
    Eigen::Vector3d & c3 )
{
  Eigen::Vector3d temp = c0-c1;
  double c01w = temp.norm()*temp.norm();
  temp = c0-c2;
  double c02w = temp.norm()*temp.norm();
  temp = c0-c3;
  double c03w = temp.norm()*temp.norm();
  temp = c1-c2;
  double c12w = temp.norm()*temp.norm();
  temp = c1-c3;
  double c13w = temp.norm()*temp.norm();

  groebnerMatrix(0,0) = ((((((((-2*m(0,0)*m(3,0)-2*m(1,0)*m(4,0))-2*m(2,0)*m(5,0))+pow(m(0,0),2))+pow(m(3,0),2))+pow(m(1,0),2))+pow(m(4,0),2))+pow(m(2,0),2))+pow(m(5,0),2));
  groebnerMatrix(0,1) = (((((((((((2*n(0,0)*m(0,0)-2*n(0,0)*m(3,0))-2*m(0,0)*n(3,0))+2*n(3,0)*m(3,0))+2*n(1,0)*m(1,0))-2*n(1,0)*m(4,0))-2*m(1,0)*n(4,0))+2*n(4,0)*m(4,0))+2*n(2,0)*m(2,0))-2*n(2,0)*m(5,0))-2*m(2,0)*n(5,0))+2*n(5,0)*m(5,0));
  groebnerMatrix(0,2) = ((((((((-2*n(0,0)*n(3,0)-2*n(1,0)*n(4,0))-2*n(2,0)*n(5,0))+pow(n(0,0),2))+pow(n(3,0),2))+pow(n(1,0),2))+pow(n(4,0),2))+pow(n(2,0),2))+pow(n(5,0),2));
  groebnerMatrix(0,3) = (((((((((((2*a(0,0)*m(0,0)-2*a(0,0)*m(3,0))-2*m(0,0)*a(3,0))+2*a(3,0)*m(3,0))+2*a(1,0)*m(1,0))-2*a(1,0)*m(4,0))-2*m(1,0)*a(4,0))+2*a(4,0)*m(4,0))+2*a(2,0)*m(2,0))-2*a(2,0)*m(5,0))-2*m(2,0)*a(5,0))+2*a(5,0)*m(5,0));
  groebnerMatrix(0,4) = (((((((((((2*a(0,0)*n(0,0)-2*a(0,0)*n(3,0))-2*n(0,0)*a(3,0))+2*a(3,0)*n(3,0))+2*a(1,0)*n(1,0))-2*a(1,0)*n(4,0))-2*n(1,0)*a(4,0))+2*a(4,0)*n(4,0))+2*a(2,0)*n(2,0))-2*a(2,0)*n(5,0))-2*n(2,0)*a(5,0))+2*a(5,0)*n(5,0));
  groebnerMatrix(0,5) = (((((((((-c01w+pow(a(0,0),2))-2*a(0,0)*a(3,0))+pow(a(3,0),2))+pow(a(1,0),2))-2*a(1,0)*a(4,0))+pow(a(4,0),2))+pow(a(2,0),2))-2*a(2,0)*a(5,0))+pow(a(5,0),2));
  groebnerMatrix(1,0) = ((((((((-2*m(0,0)*m(6,0)-2*m(1,0)*m(7,0))-2*m(2,0)*m(8,0))+pow(m(0,0),2))+pow(m(1,0),2))+pow(m(2,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2));
  groebnerMatrix(1,1) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(6,0))-2*m(0,0)*n(6,0))+2*n(6,0)*m(6,0))-2*n(1,0)*m(7,0))-2*m(1,0)*n(7,0))+2*n(7,0)*m(7,0))-2*n(2,0)*m(8,0))-2*m(2,0)*n(8,0))+2*n(8,0)*m(8,0));
  groebnerMatrix(1,2) = ((((((((-2*n(0,0)*n(6,0)-2*n(1,0)*n(7,0))-2*n(2,0)*n(8,0))+pow(n(0,0),2))+pow(n(1,0),2))+pow(n(2,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2));
  groebnerMatrix(1,3) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*a(0,0)*m(6,0))-2*m(0,0)*a(6,0))+2*a(6,0)*m(6,0))-2*a(1,0)*m(7,0))-2*m(1,0)*a(7,0))+2*a(7,0)*m(7,0))-2*a(2,0)*m(8,0))-2*m(2,0)*a(8,0))+2*a(8,0)*m(8,0));
  groebnerMatrix(1,4) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*a(0,0)*n(6,0))-2*n(0,0)*a(6,0))+2*a(6,0)*n(6,0))-2*a(1,0)*n(7,0))-2*n(1,0)*a(7,0))+2*a(7,0)*n(7,0))-2*a(2,0)*n(8,0))-2*n(2,0)*a(8,0))+2*a(8,0)*n(8,0));
  groebnerMatrix(1,5) = (((((((((-c02w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(6,0))+pow(a(6,0),2))-2*a(1,0)*a(7,0))+pow(a(7,0),2))-2*a(2,0)*a(8,0))+pow(a(8,0),2));
  groebnerMatrix(2,0) = ((((((((-2*m(0,0)*m(9,0)-2*m(1,0)*m(10,0))-2*m(2,0)*m(11,0))+pow(m(0,0),2))+pow(m(1,0),2))+pow(m(2,0),2))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2));
  groebnerMatrix(2,1) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(9,0))-2*m(0,0)*n(9,0))+2*n(9,0)*m(9,0))-2*n(1,0)*m(10,0))-2*m(1,0)*n(10,0))+2*n(10,0)*m(10,0))-2*n(2,0)*m(11,0))-2*m(2,0)*n(11,0))+2*n(11,0)*m(11,0));
  groebnerMatrix(2,2) = ((((((((-2*n(0,0)*n(9,0)-2*n(1,0)*n(10,0))-2*n(2,0)*n(11,0))+pow(n(0,0),2))+pow(n(1,0),2))+pow(n(2,0),2))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2));
  groebnerMatrix(2,3) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*a(0,0)*m(9,0))-2*m(0,0)*a(9,0))+2*a(9,0)*m(9,0))-2*a(1,0)*m(10,0))-2*m(1,0)*a(10,0))+2*a(10,0)*m(10,0))-2*a(2,0)*m(11,0))-2*m(2,0)*a(11,0))+2*a(11,0)*m(11,0));
  groebnerMatrix(2,4) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*a(0,0)*n(9,0))-2*n(0,0)*a(9,0))+2*a(9,0)*n(9,0))-2*a(1,0)*n(10,0))-2*n(1,0)*a(10,0))+2*a(10,0)*n(10,0))-2*a(2,0)*n(11,0))-2*n(2,0)*a(11,0))+2*a(11,0)*n(11,0));
  groebnerMatrix(2,5) = (((((((((-c03w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(9,0))+pow(a(9,0),2))-2*a(1,0)*a(10,0))+pow(a(10,0),2))-2*a(2,0)*a(11,0))+pow(a(11,0),2));
  groebnerMatrix(3,0) = ((((((((-2*m(3,0)*m(6,0)-2*m(4,0)*m(7,0))-2*m(5,0)*m(8,0))+pow(m(3,0),2))+pow(m(4,0),2))+pow(m(5,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2));
  groebnerMatrix(3,1) = (((((((((((2*n(3,0)*m(3,0)+2*n(4,0)*m(4,0))+2*n(5,0)*m(5,0))+2*n(6,0)*m(6,0))+2*n(7,0)*m(7,0))+2*n(8,0)*m(8,0))-2*n(3,0)*m(6,0))-2*m(3,0)*n(6,0))-2*n(4,0)*m(7,0))-2*m(4,0)*n(7,0))-2*n(5,0)*m(8,0))-2*m(5,0)*n(8,0));
  groebnerMatrix(3,2) = ((((((((-2*n(3,0)*n(6,0)-2*n(4,0)*n(7,0))-2*n(5,0)*n(8,0))+pow(n(3,0),2))+pow(n(4,0),2))+pow(n(5,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2));
  groebnerMatrix(3,3) = (((((((((((2*a(3,0)*m(3,0)+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(6,0)*m(6,0))+2*a(7,0)*m(7,0))+2*a(8,0)*m(8,0))-2*a(3,0)*m(6,0))-2*m(3,0)*a(6,0))-2*a(4,0)*m(7,0))-2*m(4,0)*a(7,0))-2*a(5,0)*m(8,0))-2*m(5,0)*a(8,0));
  groebnerMatrix(3,4) = (((((((((((2*a(3,0)*n(3,0)+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(6,0)*n(6,0))+2*a(7,0)*n(7,0))+2*a(8,0)*n(8,0))-2*a(3,0)*n(6,0))-2*n(3,0)*a(6,0))-2*a(4,0)*n(7,0))-2*n(4,0)*a(7,0))-2*a(5,0)*n(8,0))-2*n(5,0)*a(8,0));
  groebnerMatrix(3,5) = (((((((((-c12w+pow(a(3,0),2))+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(6,0),2))+pow(a(7,0),2))+pow(a(8,0),2))-2*a(3,0)*a(6,0))-2*a(4,0)*a(7,0))-2*a(5,0)*a(8,0));
  groebnerMatrix(4,0) = ((((((((-2*m(3,0)*m(9,0)-2*m(4,0)*m(10,0))-2*m(5,0)*m(11,0))+pow(m(3,0),2))+pow(m(4,0),2))+pow(m(5,0),2))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2));
  groebnerMatrix(4,1) = (((((((((((2*n(3,0)*m(3,0)+2*n(4,0)*m(4,0))+2*n(5,0)*m(5,0))+2*n(9,0)*m(9,0))+2*n(10,0)*m(10,0))+2*n(11,0)*m(11,0))-2*n(3,0)*m(9,0))-2*m(3,0)*n(9,0))-2*n(4,0)*m(10,0))-2*m(4,0)*n(10,0))-2*n(5,0)*m(11,0))-2*m(5,0)*n(11,0));
  groebnerMatrix(4,2) = ((((((((-2*n(3,0)*n(9,0)-2*n(4,0)*n(10,0))-2*n(5,0)*n(11,0))+pow(n(3,0),2))+pow(n(4,0),2))+pow(n(5,0),2))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2));
  groebnerMatrix(4,3) = (((((((((((2*a(3,0)*m(3,0)+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(9,0)*m(9,0))+2*a(10,0)*m(10,0))+2*a(11,0)*m(11,0))-2*a(3,0)*m(9,0))-2*m(3,0)*a(9,0))-2*a(4,0)*m(10,0))-2*m(4,0)*a(10,0))-2*a(5,0)*m(11,0))-2*m(5,0)*a(11,0));
  groebnerMatrix(4,4) = (((((((((((2*a(3,0)*n(3,0)+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(9,0)*n(9,0))+2*a(10,0)*n(10,0))+2*a(11,0)*n(11,0))-2*a(3,0)*n(9,0))-2*n(3,0)*a(9,0))-2*a(4,0)*n(10,0))-2*n(4,0)*a(10,0))-2*a(5,0)*n(11,0))-2*n(5,0)*a(11,0));
  groebnerMatrix(4,5) = (((((((((-c13w+pow(a(3,0),2))+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(9,0),2))+pow(a(10,0),2))+pow(a(11,0),2))-2*a(3,0)*a(9,0))-2*a(4,0)*a(10,0))-2*a(5,0)*a(11,0));
}